

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O0

error post_abs<49>(context *ctx,token *token,opcode *op)

{
  token *in_RCX;
  opcode *op_local;
  token *token_local;
  context *ctx_local;
  
  assemble_flag(ctx,(opcode *)token,in_RCX,(char *)op,0x149775);
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
}

Assistant:

DEFINE_OPERAND(abs)
{
    const bool is_absolute = token.type == token_type::vbar;
    if (is_absolute) {
        op.add_bits(1ULL << address);
        token = ctx.tokenize();
    }

    CHECK(inner(ctx, token, op));

    if (is_absolute) {
        CHECK(confirm_type(token, token_type::vbar));
        token = ctx.tokenize();
    }
    return {};
}